

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O2

void __thiscall spdlog::logger::~logger(logger *this)

{
  this->_vptr_logger = (_func_int **)&PTR__logger_00124bd0;
  std::_Function_base::~_Function_base(&(this->_err_handler).super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&this->_sinks);
  std::__cxx11::string::~string((string *)&this->_name);
  return;
}

Assistant:

inline spdlog::logger::~logger() = default;